

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_ddf01b::TGlslangToSpvTraverser::collectRayTracingLinkerObjects
          (TGlslangToSpvTraverser *this)

{
  uint uVar1;
  undefined8 *puVar2;
  int iVar3;
  uint uVar4;
  TIntermAggregate *pTVar5;
  undefined4 extraout_var;
  long *plVar6;
  long lVar7;
  TIntermNode **objSeq;
  undefined8 *puVar8;
  uint local_40 [2];
  long *local_38;
  
  pTVar5 = glslang::TIntermediate::findLinkerObjects(this->glslangIntermediate);
  iVar3 = (*(pTVar5->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(pTVar5);
  puVar2 = *(undefined8 **)(CONCAT44(extraout_var,iVar3) + 0x10);
  for (puVar8 = *(undefined8 **)(CONCAT44(extraout_var,iVar3) + 8); puVar8 != puVar2;
      puVar8 = puVar8 + 1) {
    plVar6 = (long *)(**(code **)(*(long *)*puVar8 + 0x60))();
    if ((plVar6 != (long *)0x0) &&
       (lVar7 = (**(code **)(*plVar6 + 0x108))(plVar6), (~*(uint *)(lVar7 + 0x1c) & 0xfff) != 0)) {
      lVar7 = (**(code **)(*plVar6 + 0x108))(plVar6);
      uVar1 = *(uint *)(lVar7 + 0x1c);
      lVar7 = (**(code **)(*plVar6 + 0x108))(plVar6);
      uVar4 = (*(uint *)(lVar7 + 8) & 0x7f) - 9;
      if ((uVar4 < 6) && ((0x3bU >> (uVar4 & 0x1f) & 1) != 0)) {
        local_40[0] = uVar1 & 0xfff;
        local_38 = plVar6;
        std::
        _Hashtable<unsigned_int,std::pair<unsigned_int_const,glslang::TIntermSymbol*>,std::allocator<std::pair<unsigned_int_const,glslang::TIntermSymbol*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_int,glslang::TIntermSymbol*>>
                  ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,glslang::TIntermSymbol*>,std::allocator<std::pair<unsigned_int_const,glslang::TIntermSymbol*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&this->locationToSymbol[*(long *)(&DAT_006fe540 + (ulong)uVar4 * 8)]._M_h,
                   local_40);
      }
    }
  }
  return;
}

Assistant:

void TGlslangToSpvTraverser::collectRayTracingLinkerObjects()
{
    glslang::TIntermAggregate* linkerObjects = glslangIntermediate->findLinkerObjects();
    for (auto& objSeq : linkerObjects->getSequence()) {
        auto objNode = objSeq->getAsSymbolNode();
        if (objNode != nullptr) {
            if (objNode->getQualifier().hasLocation()) {
                unsigned int location = objNode->getQualifier().layoutLocation;
                auto st = objNode->getQualifier().storage;
                int set;
                switch (st)
                {
                case glslang::EvqPayload:
                case glslang::EvqPayloadIn:
                    set = 0;
                    break;
                case glslang::EvqCallableData:
                case glslang::EvqCallableDataIn:
                    set = 1;
                    break;

                case glslang::EvqHitObjectAttrNV:
                    set = 2;
                    break;

                default:
                    set = -1;
                }
                if (set != -1)
                    locationToSymbol[set].insert(std::make_pair(location, objNode));
            }
        }
    }
}